

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

double kj::_::anon_unknown_0::NoLocaleStrtod(char *text,char **original_endptr)

{
  double dVar1;
  undefined8 uVar2;
  Fault FVar3;
  int iVar4;
  size_t sVar5;
  ArrayPtr<const_char> *in_R8;
  int *piVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  String localized;
  char *localized_endptr;
  int size;
  char *temp_endptr;
  char temp [16];
  DebugComparison<int_&,_int> local_b8;
  Fault local_90;
  long local_88;
  int local_7c;
  double local_78;
  undefined1 local_70 [8];
  char local_68 [24];
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  dVar1 = strtod(text,(char **)local_70);
  uVar7 = SUB84(dVar1,0);
  uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  if (original_endptr != (char **)0x0) {
    *original_endptr = (char *)local_70;
  }
  if (*(char *)local_70 == '.') {
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_7c = snprintf(local_68,0x10,"%.1f",0);
    uVar2 = local_b8._8_8_;
    local_b8.result = local_68[0] == '1';
    local_b8.right._0_1_ = 0x31;
    local_b8.op.content.ptr = " == ";
    local_b8.op.content.size_ = 5;
    if (!local_b8.result) {
      local_b8.left = (int *)local_68;
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x20f,FAILED,"temp[0] == \'1\'","_kjCondition,",
                 (DebugComparison<char_&,_char> *)&local_b8);
      Debug::Fault::fatal(&local_90);
    }
    local_b8.left = (int *)(local_70 + (long)local_7c + 7);
    local_b8.result = (char)*local_b8.left == '5';
    local_b8.right._0_1_ = 0x35;
    local_b8.op.content.ptr = " == ";
    local_b8.op.content.size_ = 5;
    if (!local_b8.result) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x210,FAILED,"temp[size-1] == \'5\'","_kjCondition,",
                 (DebugComparison<char_&,_char> *)&local_b8);
      Debug::Fault::fatal(&local_90);
    }
    local_b8.left = &local_7c;
    local_b8._12_4_ = SUB84(uVar2,4);
    local_b8.right = 6;
    local_b8.op.content.ptr = " <= ";
    local_b8.op.content.size_ = 5;
    local_b8.result = local_7c < 7;
    if (6 < local_7c) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x211,FAILED,"size <= 6","_kjCondition,",&local_b8);
      Debug::Fault::fatal(&local_90);
    }
    iVar4 = local_7c + -2;
    local_50.size_ = strlen((char *)((long)local_70 + 1));
    local_90.exception = (Exception *)text;
    local_88 = (long)local_70 - (long)text;
    local_50.ptr = (char *)((long)local_70 + 1);
    local_40.ptr = local_68 + 1;
    local_40.size_ = (long)iVar4;
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_b8,(_ *)&local_90,&local_40,&local_50,in_R8);
    piVar6 = local_b8.left;
    if (local_b8._8_8_ == 0) {
      piVar6 = (int *)0x1f73e6;
    }
    local_78 = strtod((char *)piVar6,(char **)&local_90);
    FVar3.exception = local_90.exception;
    uVar7 = SUB84(local_78,0);
    uVar8 = (undefined4)((ulong)local_78 >> 0x20);
    if ((original_endptr != (char **)0x0) &&
       ((long)local_70 - (long)text < (long)local_90.exception - (long)piVar6)) {
      iVar4 = 0;
      if (local_b8._8_8_ != 0) {
        iVar4 = local_b8.right + -1;
      }
      sVar5 = strlen(text);
      uVar7 = SUB84(local_78,0);
      uVar8 = (undefined4)((ulong)local_78 >> 0x20);
      *original_endptr =
           text + ((long)FVar3.exception - ((long)(iVar4 - (int)sVar5) + (long)piVar6));
    }
    uVar2 = local_b8._8_8_;
    piVar6 = local_b8.left;
    if (local_b8.left != (int *)0x0) {
      local_b8.left = (int *)0x0;
      local_b8.right = 0;
      local_b8._12_4_ = 0;
      (*(code *)**(undefined8 **)local_b8.op.content.ptr)
                (local_b8.op.content.ptr,piVar6,1,uVar2,uVar2,0);
      uVar7 = SUB84(local_78,0);
      uVar8 = (undefined4)((ulong)local_78 >> 0x20);
    }
  }
  return (double)CONCAT44(uVar8,uVar7);
}

Assistant:

double NoLocaleStrtod(const char* text, char** original_endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char* temp_endptr;
  double result = strtod(text, &temp_endptr);
  if (original_endptr != NULL) *original_endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  kj::String localized = LocalizeRadix(text, temp_endptr);
  const char* localized_cstr = localized.cStr();
  char* localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) >
      (temp_endptr - text)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update original_endptr to point at the right location.
    if (original_endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(text);
      // const_cast is necessary to match the strtod() interface.
      *original_endptr = const_cast<char*>(
        text + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}